

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

SatLookAngles *
getSatellitesAndLookAngles
          (SatLookAngles *__return_storage_ptr__,double lat,double lon,double alt,DB *db)

{
  pointer tle;
  vector<Tle,_std::allocator<Tle>_> tles;
  vector<Tle,_std::allocator<Tle>_> local_110;
  Tle local_f8;
  
  SatLookAngles::SatLookAngles(__return_storage_ptr__,lat,lon,alt);
  (**db->_vptr_DB)(&local_110,db);
  for (tle = local_110.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data
             ._M_start;
      tle != local_110.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data
             ._M_finish; tle = tle + 1) {
    Tle::Tle(&local_f8,tle);
    SatLookAngles::add(__return_storage_ptr__,&local_f8);
    Tle::~Tle(&local_f8);
  }
  SatLookAngles::sort(__return_storage_ptr__);
  std::vector<Tle,_std::allocator<Tle>_>::~vector(&local_110);
  return __return_storage_ptr__;
}

Assistant:

SatLookAngles getSatellitesAndLookAngles(double lat, double lon, double alt,
                                         DB &db) {
  SatLookAngles sats(lat, lon, alt);

  // Get the TLEs.
  std::vector<Tle> tles = db.fetchTLEs();

  // Add the TLEs (this will automatically generate look angles.).
  for (const auto &tle : tles)
    sats.add(tle);

  // Sort by increasing range.
  sats.sort();
  return sats;
}